

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

int tcg_can_emit_vec_op_sparc
              (TCGContext_conflict7 *tcg_ctx,TCGOpcode opc,TCGType_conflict type,uint vece)

{
  bool bVar1;
  
  switch(opc) {
  case INDEX_op_add_vec:
  case INDEX_op_sub_vec:
  case INDEX_op_and_vec:
  case INDEX_op_or_vec:
  case INDEX_op_xor_vec:
  case INDEX_op_andc_vec:
    return 1;
  case INDEX_op_mul_vec:
    return -(uint)(vece == 0) | (uint)(vece != 3);
  default:
    return 0;
  case INDEX_op_abs_vec:
  case INDEX_op_smin_vec:
  case INDEX_op_umin_vec:
  case INDEX_op_smax_vec:
  case INDEX_op_umax_vec:
    bVar1 = vece < 3;
    break;
  case INDEX_op_shli_vec:
  case INDEX_op_shri_vec:
    return -(uint)(vece == 0) | 1;
  case INDEX_op_sari_vec:
    if (vece == 0) {
      return -1;
    }
    if (vece != 3) {
      return 1;
    }
    return (type < TCG_TYPE_V256) - 1;
  case INDEX_op_shls_vec:
  case INDEX_op_shrs_vec:
    return (int)(vece != 0);
  case INDEX_op_sars_vec:
    vece = vece - 1;
  case INDEX_op_ssadd_vec:
  case INDEX_op_usadd_vec:
  case INDEX_op_sssub_vec:
  case INDEX_op_ussub_vec:
    bVar1 = vece < 2;
    break;
  case INDEX_op_shlv_vec:
  case INDEX_op_shrv_vec:
    bVar1 = 1 < vece;
    goto LAB_009d500a;
  case INDEX_op_sarv_vec:
    bVar1 = vece == 2;
LAB_009d500a:
    return (int)(byte)(bVar1 & have_avx2_sparc);
  case INDEX_op_cmp_vec:
  case INDEX_op_cmpsel_vec:
    return -1;
  }
  return (int)bVar1;
}

Assistant:

int tcg_can_emit_vec_op(TCGContext *tcg_ctx, TCGOpcode opc, TCGType type, unsigned vece)
{
    switch (opc) {
    case INDEX_op_add_vec:
    case INDEX_op_sub_vec:
    case INDEX_op_and_vec:
    case INDEX_op_or_vec:
    case INDEX_op_xor_vec:
    case INDEX_op_andc_vec:
        return 1;
    case INDEX_op_cmp_vec:
    case INDEX_op_cmpsel_vec:
        return -1;

    case INDEX_op_shli_vec:
    case INDEX_op_shri_vec:
        /* We must expand the operation for MO_8.  */
        return vece == MO_8 ? -1 : 1;

    case INDEX_op_sari_vec:
        /* We must expand the operation for MO_8.  */
        if (vece == MO_8) {
            return -1;
        }
        /* We can emulate this for MO_64, but it does not pay off
           unless we're producing at least 4 values.  */
        if (vece == MO_64) {
            return type >= TCG_TYPE_V256 ? -1 : 0;
        }
        return 1;

    case INDEX_op_shls_vec:
    case INDEX_op_shrs_vec:
        return vece >= MO_16;
    case INDEX_op_sars_vec:
        return vece >= MO_16 && vece <= MO_32;

    case INDEX_op_shlv_vec:
    case INDEX_op_shrv_vec:
        return have_avx2 && vece >= MO_32;
    case INDEX_op_sarv_vec:
        return have_avx2 && vece == MO_32;

    case INDEX_op_mul_vec:
        if (vece == MO_8) {
            /* We can expand the operation for MO_8.  */
            return -1;
        }
        if (vece == MO_64) {
            return 0;
        }
        return 1;

    case INDEX_op_ssadd_vec:
    case INDEX_op_usadd_vec:
    case INDEX_op_sssub_vec:
    case INDEX_op_ussub_vec:
        return vece <= MO_16;
    case INDEX_op_smin_vec:
    case INDEX_op_smax_vec:
    case INDEX_op_umin_vec:
    case INDEX_op_umax_vec:
    case INDEX_op_abs_vec:
        return vece <= MO_32;

    default:
        return 0;
    }
}